

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_object.cpp
# Opt level: O0

value * mjs::anon_unknown_37::date_helper::to_json
                  (value *__return_storage_ptr__,gc_heap_ptr<mjs::global_object> *global,value *val)

{
  uint32_t *o_00;
  double __x;
  bool bVar1;
  value_type vVar2;
  global_object *pgVar3;
  object *poVar4;
  vector<mjs::value,_std::allocator<mjs::value>_> local_108;
  value local_f0;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> local_c8;
  undefined1 local_b8 [8];
  value to_iso;
  value local_80;
  undefined1 local_58 [8];
  value tv;
  object_ptr o;
  value *val_local;
  gc_heap_ptr<mjs::global_object> *global_local;
  
  pgVar3 = gc_heap_ptr<mjs::global_object>::operator->(global);
  o_00 = &tv.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.
          pos_;
  (*(pgVar3->super_object)._vptr_object[0x11])(o_00,pgVar3,val);
  value::value(&local_80,(object_ptr *)o_00);
  to_primitive((value *)local_58,&local_80,number);
  value::~value(&local_80);
  vVar2 = value::type((value *)local_58);
  if (vVar2 == number) {
    __x = value::number_value((value *)local_58);
    bVar1 = std::isfinite(__x);
    if (!bVar1) {
      value::value(__return_storage_ptr__,(value *)value::null);
      to_iso.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.
      pos_ = 1;
      goto LAB_001dc9fb;
    }
  }
  poVar4 = gc_heap_ptr<mjs::object>::operator->
                     ((gc_heap_ptr<mjs::object> *)
                      &tv.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.
                       super_gc_heap_ptr_untyped.pos_);
  std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
            (&local_c8,L"toISOString");
  (**poVar4->_vptr_object)(local_b8,poVar4,&local_c8);
  value::value(&local_f0,
               (object_ptr *)
               &tv.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.
                super_gc_heap_ptr_untyped.pos_);
  local_108.super__Vector_base<mjs::value,_std::allocator<mjs::value>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_108.super__Vector_base<mjs::value,_std::allocator<mjs::value>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_108.super__Vector_base<mjs::value,_std::allocator<mjs::value>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<mjs::value,_std::allocator<mjs::value>_>::vector(&local_108);
  call_function(__return_storage_ptr__,(value *)local_b8,&local_f0,&local_108);
  std::vector<mjs::value,_std::allocator<mjs::value>_>::~vector(&local_108);
  value::~value(&local_f0);
  to_iso.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_
       = 1;
  value::~value((value *)local_b8);
LAB_001dc9fb:
  value::~value((value *)local_58);
  gc_heap_ptr<mjs::object>::~gc_heap_ptr
            ((gc_heap_ptr<mjs::object> *)
             &tv.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.
              super_gc_heap_ptr_untyped.pos_);
  return __return_storage_ptr__;
}

Assistant:

static value to_json(const gc_heap_ptr<global_object>& global, const value& val) {
        auto o = global->to_object(val);
        auto tv = to_primitive(value{o}, value_type::number);
        if (tv.type() == value_type::number && !std::isfinite(tv.number_value())) {
            return value::null;
        }
        auto to_iso = o->get(L"toISOString");
        return call_function(to_iso, value{o}, {});
    }